

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.h
# Opt level: O0

void __thiscall
dlib::con_<64l,7l,7l,2,2,0,0>::
setup<dlib::add_layer<dlib::con_<64l,7l,7l,2,2,0,0>,dlib::input_rgb_image,void>::subnet_wrapper>
          (con_<64L,_7L,_7L,_2,_2,_0,_0> *this,subnet_wrapper *sub)

{
  tensor *ptVar1;
  subnet_wrapper *in_RSI;
  long in_RDI;
  alias_tensor_instance *this_00;
  rand rnd;
  long num_outputs;
  long num_inputs;
  long filt_nc;
  long filt_nr;
  undefined4 in_stack_ffffffffffffead8;
  float in_stack_ffffffffffffeadc;
  alias_tensor *in_stack_ffffffffffffeae0;
  longlong in_stack_ffffffffffffeae8;
  rand *in_stack_ffffffffffffeaf0;
  unsigned_long in_stack_ffffffffffffeaf8;
  resizable_tensor *in_stack_ffffffffffffeb00;
  alias_tensor *this_01;
  size_t in_stack_ffffffffffffed58;
  tensor *in_stack_ffffffffffffed60;
  alias_tensor *in_stack_ffffffffffffed68;
  
  ptVar1 = add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>::
           subnet_wrapper::get_output(in_RSI);
  tensor::k(ptVar1);
  resizable_tensor::set_size
            (in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8,(longlong)in_stack_ffffffffffffeaf0
             ,in_stack_ffffffffffffeae8,(longlong)in_stack_ffffffffffffeae0);
  ::rand();
  rand::rand((rand *)&stack0xffffffffffffec08);
  randomize_parameters
            (&in_stack_ffffffffffffeb00->super_tensor,in_stack_ffffffffffffeaf8,
             in_stack_ffffffffffffeaf0);
  this_01 = *(alias_tensor **)(in_RDI + 0x168);
  ptVar1 = add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>::
           subnet_wrapper::get_output(in_RSI);
  tensor::k(ptVar1);
  alias_tensor::alias_tensor
            (this_01,in_stack_ffffffffffffeaf8,(longlong)in_stack_ffffffffffffeaf0,
             in_stack_ffffffffffffeae8,(longlong)in_stack_ffffffffffffeae0);
  alias_tensor::operator=
            (in_stack_ffffffffffffeae0,
             (alias_tensor *)CONCAT44(in_stack_ffffffffffffeadc,in_stack_ffffffffffffead8));
  alias_tensor::~alias_tensor((alias_tensor *)0x151759);
  if ((*(byte *)(in_RDI + 0x178) & 1) != 0) {
    alias_tensor::alias_tensor
              (this_01,in_stack_ffffffffffffeaf8,(longlong)in_stack_ffffffffffffeaf0,
               in_stack_ffffffffffffeae8,(longlong)in_stack_ffffffffffffeae0);
    this_00 = (alias_tensor_instance *)(in_RDI + 0xe0);
    alias_tensor::operator=
              ((alias_tensor *)this_00,
               (alias_tensor *)CONCAT44(in_stack_ffffffffffffeadc,in_stack_ffffffffffffead8));
    alias_tensor::~alias_tensor((alias_tensor *)0x1517bf);
    alias_tensor::size((alias_tensor *)(in_RDI + 0x98));
    alias_tensor::operator()
              (in_stack_ffffffffffffed68,in_stack_ffffffffffffed60,in_stack_ffffffffffffed58);
    alias_tensor_instance::operator=(this_00,in_stack_ffffffffffffeadc);
    alias_tensor_instance::~alias_tensor_instance((alias_tensor_instance *)0x151814);
  }
  rand::~rand((rand *)&stack0xffffffffffffec08);
  return;
}

Assistant:

void setup (const SUBNET& sub)
        {
            const long filt_nr = _nr!=0 ? _nr : sub.get_output().nr();
            const long filt_nc = _nc!=0 ? _nc : sub.get_output().nc();

            long num_inputs = filt_nr*filt_nc*sub.get_output().k();
            long num_outputs = num_filters_;
            // allocate params for the filters and also for the filter bias values.
            params.set_size(num_inputs*num_filters_ + static_cast<int>(use_bias) * num_filters_);

            dlib::rand rnd(std::rand());
            randomize_parameters(params, num_inputs+num_outputs, rnd);

            filters = alias_tensor(num_filters_, sub.get_output().k(), filt_nr, filt_nc);
            if (use_bias)
            {
                biases = alias_tensor(1,num_filters_);
                // set the initial bias values to zero
                biases(params,filters.size()) = 0;
            }
        }